

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void opj_j2k_destroy(opj_j2k_t *p_j2k)

{
  void *ptr;
  int iVar1;
  OPJ_BYTE *pOVar2;
  OPJ_BYTE **ppOVar3;
  opj_tcp_t *poVar4;
  long lVar5;
  OPJ_UINT32 i;
  ulong uVar6;
  bool bVar7;
  long lStack_30;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    return;
  }
  if (p_j2k->m_is_decoder == 0) {
    pOVar2 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data;
    if (pOVar2 != (OPJ_BYTE *)0x0) {
      opj_free(pOVar2);
      (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = (OPJ_BYTE *)0x0;
    }
    pOVar2 = (p_j2k->m_specific_param).m_decoder.m_header_data;
    if (pOVar2 != (OPJ_BYTE *)0x0) {
      opj_free(pOVar2);
      (p_j2k->m_specific_param).m_decoder.m_header_data = (OPJ_BYTE *)0x0;
      (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current = (OPJ_BYTE *)0x0;
    }
    pOVar2 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    if (pOVar2 == (OPJ_BYTE *)0x0) goto LAB_0010a936;
    ppOVar3 = &(p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    lStack_30 = 0x48;
  }
  else {
    poVar4 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
    if (poVar4 != (opj_tcp_t *)0x0) {
      opj_j2k_tcp_destroy(poVar4);
      opj_free((p_j2k->m_specific_param).m_decoder.m_default_tcp);
      (p_j2k->m_specific_param).m_decoder.m_default_tcp = (opj_tcp_t *)0x0;
    }
    pOVar2 = (p_j2k->m_specific_param).m_decoder.m_header_data;
    if (pOVar2 == (OPJ_BYTE *)0x0) goto LAB_0010a936;
    ppOVar3 = &(p_j2k->m_specific_param).m_decoder.m_header_data;
    lStack_30 = 0x20;
  }
  opj_free(pOVar2);
  *ppOVar3 = (OPJ_BYTE *)0x0;
  *(undefined4 *)((long)&p_j2k->m_is_decoder + lStack_30) = 0;
LAB_0010a936:
  opj_tcd_destroy(p_j2k->m_tcd);
  poVar4 = (p_j2k->m_cp).tcps;
  if (poVar4 != (opj_tcp_t *)0x0) {
    iVar1 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
    while (bVar7 = iVar1 != 0, iVar1 = iVar1 + -1, bVar7) {
      opj_j2k_tcp_destroy(poVar4);
      poVar4 = poVar4 + 1;
    }
    opj_free((p_j2k->m_cp).tcps);
    (p_j2k->m_cp).tcps = (opj_tcp_t *)0x0;
  }
  if ((p_j2k->m_cp).ppm_markers != (opj_ppx *)0x0) {
    lVar5 = 0;
    for (uVar6 = 0; uVar6 < (p_j2k->m_cp).ppm_markers_count; uVar6 = uVar6 + 1) {
      ptr = *(void **)((long)&((p_j2k->m_cp).ppm_markers)->m_data + lVar5);
      if (ptr != (void *)0x0) {
        opj_free(ptr);
      }
      lVar5 = lVar5 + 0x10;
    }
    (p_j2k->m_cp).ppm_markers_count = 0;
    opj_free((p_j2k->m_cp).ppm_markers);
    (p_j2k->m_cp).ppm_markers = (opj_ppx *)0x0;
  }
  opj_free((p_j2k->m_cp).ppm_buffer);
  (p_j2k->m_cp).ppm_buffer = (OPJ_BYTE *)0x0;
  (p_j2k->m_cp).ppm_data = (OPJ_BYTE *)0x0;
  opj_free((p_j2k->m_cp).comment);
  (p_j2k->m_cp).comment = (OPJ_CHAR *)0x0;
  if (((p_j2k->m_cp).field_0x90 & 2) == 0) {
    opj_free((p_j2k->m_cp).m_specific_param.m_enc.m_matrice);
  }
  memset(&p_j2k->m_cp,0,0x98);
  opj_procedure_list_destroy(p_j2k->m_procedure_list);
  p_j2k->m_procedure_list = (opj_procedure_list_t *)0x0;
  opj_procedure_list_destroy(p_j2k->m_validation_list);
  p_j2k->m_procedure_list = (opj_procedure_list_t *)0x0;
  j2k_destroy_cstr_index(p_j2k->cstr_index);
  p_j2k->cstr_index = (opj_codestream_index_t *)0x0;
  opj_image_destroy(p_j2k->m_private_image);
  p_j2k->m_private_image = (opj_image_t *)0x0;
  opj_image_destroy(p_j2k->m_output_image);
  p_j2k->m_output_image = (opj_image_t *)0x0;
  opj_free(p_j2k);
  return;
}

Assistant:

void opj_j2k_destroy (opj_j2k_t *p_j2k)
{
        if (p_j2k == 00) {
                return;
        }

        if (p_j2k->m_is_decoder) {

                if (p_j2k->m_specific_param.m_decoder.m_default_tcp != 00) {
                        opj_j2k_tcp_destroy(p_j2k->m_specific_param.m_decoder.m_default_tcp);
                        opj_free(p_j2k->m_specific_param.m_decoder.m_default_tcp);
                        p_j2k->m_specific_param.m_decoder.m_default_tcp = 00;
                }

                if (p_j2k->m_specific_param.m_decoder.m_header_data != 00) {
                        opj_free(p_j2k->m_specific_param.m_decoder.m_header_data);
                        p_j2k->m_specific_param.m_decoder.m_header_data = 00;
                        p_j2k->m_specific_param.m_decoder.m_header_data_size = 0;
                }
        }
        else {

                if (p_j2k->m_specific_param.m_encoder.m_encoded_tile_data) {
                        opj_free(p_j2k->m_specific_param.m_encoder.m_encoded_tile_data);
                        p_j2k->m_specific_param.m_encoder.m_encoded_tile_data = 00;
                }

                if (p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer) {
                        opj_free(p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer);
                        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer = 00;
                        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current = 00;
                }

                if (p_j2k->m_specific_param.m_encoder.m_header_tile_data) {
                        opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
                        p_j2k->m_specific_param.m_encoder.m_header_tile_data = 00;
                        p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;
                }
        }

        opj_tcd_destroy(p_j2k->m_tcd);

        opj_j2k_cp_destroy(&(p_j2k->m_cp));
        memset(&(p_j2k->m_cp),0,sizeof(opj_cp_t));

        opj_procedure_list_destroy(p_j2k->m_procedure_list);
        p_j2k->m_procedure_list = 00;

        opj_procedure_list_destroy(p_j2k->m_validation_list);
        p_j2k->m_procedure_list = 00;

        j2k_destroy_cstr_index(p_j2k->cstr_index);
        p_j2k->cstr_index = NULL;

        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = NULL;

        opj_image_destroy(p_j2k->m_output_image);
        p_j2k->m_output_image = NULL;

        opj_free(p_j2k);
}